

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http.c
# Opt level: O0

char * ngx_http_merge_locations
                 (ngx_conf_t *cf,ngx_queue_t *locations,void **loc_conf,ngx_http_module_t *module,
                 ngx_uint_t ctx_index)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  void **local_80;
  ngx_http_location_queue_t *lq;
  ngx_http_core_loc_conf_t *clcf;
  ngx_http_conf_ctx_t saved;
  ngx_http_conf_ctx_t *ctx;
  ngx_queue_t *q;
  char *rv;
  ngx_uint_t ctx_index_local;
  ngx_http_module_t *module_local;
  void **loc_conf_local;
  ngx_queue_t *locations_local;
  ngx_conf_t *cf_local;
  
  if (locations != (ngx_queue_t *)0x0) {
    puVar1 = (undefined8 *)cf->ctx;
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    for (ctx = (ngx_http_conf_ctx_t *)locations->next; ctx != (ngx_http_conf_ctx_t *)locations;
        ctx = (ngx_http_conf_ctx_t *)ctx->srv_conf) {
      if (ctx->loc_conf == (void **)0x0) {
        local_80 = ctx[1].main_conf;
      }
      else {
        local_80 = ctx->loc_conf;
      }
      puVar1[2] = local_80[6];
      pcVar5 = (*module->merge_loc_conf)
                         (cf,loc_conf[ctx_index],*(void **)((long)local_80[6] + ctx_index * 8));
      if (pcVar5 != (char *)0x0) {
        return pcVar5;
      }
      pcVar5 = ngx_http_merge_locations
                         (cf,(ngx_queue_t *)local_80[0x53],(void **)local_80[6],module,ctx_index);
      if (pcVar5 != (char *)0x0) {
        return pcVar5;
      }
    }
    *puVar1 = uVar2;
    puVar1[1] = uVar3;
    puVar1[2] = uVar4;
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_merge_locations(ngx_conf_t *cf, ngx_queue_t *locations,
    void **loc_conf, ngx_http_module_t *module, ngx_uint_t ctx_index)
{
    char                       *rv;
    ngx_queue_t                *q;
    ngx_http_conf_ctx_t        *ctx, saved;
    ngx_http_core_loc_conf_t   *clcf;
    ngx_http_location_queue_t  *lq;

    if (locations == NULL) {
        return NGX_CONF_OK;
    }

    ctx = (ngx_http_conf_ctx_t *) cf->ctx;
    saved = *ctx;

    for (q = ngx_queue_head(locations);
         q != ngx_queue_sentinel(locations);
         q = ngx_queue_next(q))
    {
        lq = (ngx_http_location_queue_t *) q;

        clcf = lq->exact ? lq->exact : lq->inclusive;
        ctx->loc_conf = clcf->loc_conf;

        rv = module->merge_loc_conf(cf, loc_conf[ctx_index],
                                    clcf->loc_conf[ctx_index]);
        if (rv != NGX_CONF_OK) {
            return rv;
        }

        rv = ngx_http_merge_locations(cf, clcf->locations, clcf->loc_conf,
                                      module, ctx_index);
        if (rv != NGX_CONF_OK) {
            return rv;
        }
    }

    *ctx = saved;

    return NGX_CONF_OK;
}